

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testDeserializeNewOrderSingle(int count)

{
  undefined1 *puVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  string string;
  Symbol symbol;
  ClOrdID clOrdID;
  NewOrderSingle message;
  Side side;
  HandlInst handlInst;
  OrdType ordType;
  TransactTime transactTime;
  long *local_3c0 [2];
  long local_3b0 [2];
  timeval local_3a0;
  undefined1 local_390 [16];
  _Alloc_hider local_380;
  char local_370 [16];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  field_metrics local_340;
  undefined1 local_338 [16];
  _Alloc_hider local_328;
  char local_318 [16];
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  field_metrics local_2e8;
  NewOrderSingle local_2e0;
  FieldBase local_188;
  FieldBase local_130;
  FieldBase local_d8;
  FieldBase local_80;
  
  puVar1 = &local_2e0.super_Message.field_0x10;
  local_2e0.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"ORDERID","");
  local_338._0_8_ = &PTR__FieldBase_0011c4b8;
  local_338._8_4_ = 0xb;
  local_328._M_p = local_318;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_328,local_2e0.super_Message._0_8_,
             (undefined1 *)(local_2e0.super_Message._0_8_ + local_2e0.super_Message._8_8_));
  local_308._M_p = (pointer)&local_2f8;
  local_300 = 0;
  local_2f8._M_local_buf[0] = '\0';
  local_2e8.m_length = 0;
  local_2e8.m_checksum = 0;
  local_338._0_8_ = &PTR__FieldBase_0011c538;
  if ((undefined1 *)local_2e0.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_2e0.super_Message._0_8_,local_2e0.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_130,0x15,'1');
  local_130._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c570;
  local_2e0.super_Message._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"LNUX","");
  local_390._0_8_ = &PTR__FieldBase_0011c4b8;
  local_390._8_4_ = 0x37;
  local_380._M_p = local_370;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_2e0.super_Message._0_8_,
             (undefined1 *)(local_2e0.super_Message._0_8_ + local_2e0.super_Message._8_8_));
  local_360._M_p = (pointer)&local_350;
  local_358 = 0;
  local_350._M_local_buf[0] = '\0';
  local_340.m_length = 0;
  local_340.m_checksum = 0;
  local_390._0_8_ = &PTR__FieldBase_0011c5e0;
  if ((undefined1 *)local_2e0.super_Message._0_8_ != puVar1) {
    operator_delete((void *)local_2e0.super_Message._0_8_,local_2e0.super_Message._16_8_ + 1);
  }
  FIX::CharField::CharField((CharField *)&local_188,0x36,'1');
  local_188._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c618;
  FIX::TransactTime::now();
  FIX::CharField::CharField((CharField *)&local_d8,0x28,'1');
  local_d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6c0;
  FIX42::NewOrderSingle::NewOrderSingle
            (&local_2e0,(ClOrdID *)local_338,(HandlInst *)&local_130,(Symbol *)local_390,
             (Side *)&local_188,(TransactTime *)&local_80,(OrdType *)&local_d8);
  FIX::Message::toString_abi_cxx11_((int)local_3c0,(int)&local_2e0,8);
  gettimeofday(&local_3a0,(__timezone_ptr_t)0x0);
  _Var3 = local_3a0.tv_usec;
  _Var2 = local_3a0.tv_sec;
  if (0 < count) {
    do {
      FIX::Message::setString
                ((string *)&local_2e0,SUB81(local_3c0,0),(DataDictionary *)0x0,
                 (DataDictionary *)
                 s_dataDictionary._M_t.
                 super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
                 .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_3a0,(__timezone_ptr_t)0x0);
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  FIX::Message::~Message((Message *)&local_2e0);
  FIX::FieldBase::~FieldBase(&local_d8);
  FIX::FieldBase::~FieldBase(&local_80);
  FIX::FieldBase::~FieldBase(&local_188);
  FIX::FieldBase::~FieldBase((FieldBase *)local_390);
  FIX::FieldBase::~FieldBase(&local_130);
  FIX::FieldBase::~FieldBase((FieldBase *)local_338);
  return (local_3a0.tv_usec - (_Var3 + (long)((double)_Var2 * 1000000.0))) +
         (long)((double)local_3a0.tv_sec * 1000000.0);
}

Assistant:

long testDeserializeNewOrderSingle(int count) {
  FIX::ClOrdID clOrdID("ORDERID");
  FIX::HandlInst handlInst('1');
  FIX::Symbol symbol("LNUX");
  FIX::Side side(FIX::Side_BUY);
  FIX::TransactTime transactTime = FIX::TransactTime::now();
  FIX::OrdType ordType(FIX::OrdType_MARKET);
  FIX42::NewOrderSingle message(clOrdID, handlInst, symbol, side, transactTime, ordType);
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}